

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CompactReporter::sectionEnded(CompactReporter *this,SectionStats *_sectionStats)

{
  bool bVar1;
  ostream *poVar2;
  long in_RSI;
  long in_RDI;
  double dur;
  double in_stack_00000108;
  __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff90;
  IConfig *in_stack_ffffffffffffff98;
  string local_38 [32];
  undefined8 local_18;
  long local_10;
  
  local_18 = *(undefined8 *)(in_RSI + 0x70);
  local_10 = in_RSI;
  clara::std::__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*(in_stack_ffffffffffffff90);
  bVar1 = shouldShowDuration(in_stack_ffffffffffffff98,(double)in_stack_ffffffffffffff90);
  if (bVar1) {
    poVar2 = *(ostream **)(in_RDI + 0x18);
    getFormattedDuration_abi_cxx11_(in_stack_00000108);
    poVar2 = std::operator<<(poVar2,local_38);
    poVar2 = std::operator<<(poVar2," s: ");
    poVar2 = std::operator<<(poVar2,(string *)(local_10 + 8));
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void CompactReporter::sectionEnded(SectionStats const& _sectionStats) {
            double dur = _sectionStats.durationInSeconds;
            if ( shouldShowDuration( *m_config, dur ) ) {
                stream << getFormattedDuration( dur ) << " s: " << _sectionStats.sectionInfo.name << '\n';
            }
        }